

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status
filemgr_copy_file_range
          (filemgr *src_file,filemgr *dst_file,bid_t src_bid,bid_t dst_bid,bid_t clone_len)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  atomic<unsigned_long> *in_R8;
  fdb_status fs;
  uint32_t blocksize;
  uint uVar1;
  undefined4 local_4;
  
  uVar1 = *(uint *)(in_RDI + 0x10);
  local_4 = (**(code **)(*(long *)(in_RSI + 0xe8) + 0x78))
                      (*(undefined4 *)(in_RDI + 0x16c),*(undefined4 *)(in_RDI + 0x14),
                       *(undefined4 *)(in_RSI + 0x14),in_RDX * (ulong)uVar1,in_RCX * (ulong)uVar1,
                       (long)in_R8 * (ulong)uVar1);
  if (local_4 == FDB_RESULT_SUCCESS) {
    atomic_store_uint64_t(in_R8,(ulong)uVar1 << 0x20,memory_order_relaxed);
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

fdb_status filemgr_copy_file_range(struct filemgr *src_file,
                                   struct filemgr *dst_file,
                                   bid_t src_bid, bid_t dst_bid,
                                   bid_t clone_len)
{
    uint32_t blocksize = src_file->blocksize;
    fdb_status fs = (fdb_status)dst_file->ops->copy_file_range(
                                            src_file->fs_type,
                                            src_file->fd,
                                            dst_file->fd,
                                            src_bid * blocksize,
                                            dst_bid * blocksize,
                                            clone_len * blocksize);
    if (fs != FDB_RESULT_SUCCESS) {
        return fs;
    }
    atomic_store_uint64_t(&dst_file->pos, (dst_bid + clone_len) * blocksize);
    return FDB_RESULT_SUCCESS;
}